

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  cmMakefile *this_00;
  string *psVar1;
  char *pcVar2;
  string language;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  cmGeneratorExpressionInterpreter genexInterpreter;
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  cmGeneratorExpressionInterpreter local_90;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cmSourceFile::GetLanguage_abi_cxx11_(&local_130,source);
  if (local_130._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_130);
  }
  this_00 = lg->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_f0);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  cmLocalGenerator::GetTargetCompileFlags(lg,gtgt,psVar1,&local_130,__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_b0,(string *)psVar1);
  std::__cxx11::string::string((string *)&local_d0,(string *)&local_130);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_90,lg,&local_b0,gtgt,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"COMPILE_FLAGS",(allocator<char> *)&local_110);
  pcVar2 = cmSourceFile::GetProperty(source,&local_f0);
  if (pcVar2 != (char *)0x0) {
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(&local_90,pcVar2,&local_f0);
    (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,psVar1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"COMPILE_OPTIONS",&local_131);
  pcVar2 = cmSourceFile::GetProperty(source,&local_110);
  if (pcVar2 != (char *)0x0) {
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(&local_90,pcVar2,&local_110);
    cmLocalGenerator::AppendCompileOptions(lg,__return_storage_ptr__,psVar1,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_90);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetLanguage();
  if (language.empty()) {
    language = "C";
  }
  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, gtgt,
                                                    language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (const char* cflags = source->GetProperty(COMPILE_FLAGS)) {
    lg->AppendFlags(flags, genexInterpreter.Evaluate(cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (const char* coptions = source->GetProperty(COMPILE_OPTIONS)) {
    lg->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(coptions, COMPILE_OPTIONS));
  }

  return flags;
}